

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_checkpointer.cpp
# Opt level: O3

vector<duckdb::CheckpointAnalyzeResult,_true> * __thiscall
duckdb::ColumnDataCheckpointer::DetectBestCompressionMethod
          (vector<duckdb::CheckpointAnalyzeResult,_true> *__return_storage_ptr__,
          ColumnDataCheckpointer *this)

{
  vector<duckdb::vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>,_true>
  *this_00;
  CompressionType compression_type;
  value_type vVar1;
  value_type vVar2;
  compression_final_analyze_t p_Var3;
  ColumnData *pCVar4;
  _Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_> _Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4;
  CompressionType CVar6;
  int iVar7;
  DBConfig *pDVar8;
  const_reference pvVar9;
  reference pvVar10;
  CompressionType *pCVar11;
  reference pvVar12;
  reference this_01;
  type pAVar13;
  idx_t iVar14;
  reference pvVar15;
  Logger *this_02;
  char *pcVar16;
  reference pvVar17;
  FatalException *this_03;
  size_type __n;
  _Head_base<0UL,_duckdb::AnalyzeState_*,_false> _Var18;
  size_type __n_00;
  size_type __n_01;
  reference rVar19;
  unsigned_long in_stack_fffffffffffffe88;
  idx_t iVar20;
  CompressionFunction *pCVar21;
  undefined8 in_stack_fffffffffffffe98;
  ColumnDataCheckpointer *pCVar22;
  _Head_base<0UL,_duckdb::AnalyzeState_*,_false> in_stack_fffffffffffffea8;
  _Head_base<0UL,_duckdb::AnalyzeState_*,_false> _Var23;
  size_type local_148;
  _Any_data local_130;
  code *local_120;
  code *local_118;
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>,_true>,_true>
  *local_110;
  vector<duckdb::vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>,_true>
  *local_108;
  vector<bool,_true> *local_100;
  reference local_f8;
  reference local_f0;
  vector<duckdb::CompressionType,_true> forced_methods;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  pDVar8 = DBConfig::GetConfig(this->db);
  local_130._M_unused._M_member_pointer = local_130._M_unused._M_member_pointer & 0xffffffffffffff00
  ;
  ::std::vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>::vector
            (&forced_methods.
              super_vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>,
             (long)(this->checkpoint_states->
                   super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                   ).
                   super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->checkpoint_states->
                   super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                   ).
                   super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,
             (value_type *)local_130._M_pod_data,(allocator_type *)&stack0xfffffffffffffe9f);
  pvVar9 = vector<duckdb::CompressionType,_true>::operator[]
                     (this->checkpoint_info->info->compression_types,
                      this->checkpoint_info->column_idx);
  if ((this->checkpoint_states->
      super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
      ).
      super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->checkpoint_states->
      super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
      ).
      super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    compression_type = *pvVar9;
    this_00 = &this->compression_functions;
    __n_00 = 0;
    do {
      pvVar10 = vector<duckdb::vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>,_true>
                ::operator[](this_00,__n_00);
      if (compression_type == COMPRESSION_AUTO) {
        CVar6 = (pDVar8->options).force_compression;
        if (CVar6 != COMPRESSION_AUTO) {
          CVar6 = ForceCompression(pvVar10,CVar6);
          pCVar11 = vector<duckdb::CompressionType,_true>::operator[](&forced_methods,__n_00);
          goto LAB_010d64c4;
        }
      }
      else {
        CVar6 = ForceCompression(pvVar10,compression_type);
        pCVar11 = vector<duckdb::CompressionType,_true>::operator[](&forced_methods,__n_00);
LAB_010d64c4:
        *pCVar11 = CVar6;
      }
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)((long)(this->checkpoint_states->
                                    super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                                    ).
                                    super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->checkpoint_states->
                                    super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                                    ).
                                    super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pCVar22 = this;
  InitAnalyze(this);
  local_130._8_8_ = 0;
  local_118 = ::std::
              _Function_handler<void_(duckdb::Vector_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/table/column_data_checkpointer.cpp:175:15)>
              ::_M_invoke;
  local_120 = ::std::
              _Function_handler<void_(duckdb::Vector_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/table/column_data_checkpointer.cpp:175:15)>
              ::_M_manager;
  local_130._M_unused._0_8_ = (undefined8)this;
  ScanSegments(this,(function<void_(duckdb::Vector_&,_unsigned_long)> *)&local_130);
  if (local_120 != (code *)0x0) {
    (*local_120)(&local_130,&local_130,3);
  }
  (__return_storage_ptr__->
  super_vector<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>).
  super__Vector_base<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>).
  super__Vector_base<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>).
  super__Vector_base<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>::
  resize(&__return_storage_ptr__->
          super_vector<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>
         ,(long)(this->checkpoint_states->
                super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                ).
                super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->checkpoint_states->
                super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                ).
                super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3);
  if ((this->checkpoint_states->
      super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
      ).
      super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->checkpoint_states->
      super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
      ).
      super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_100 = &this->has_changes;
    local_108 = &this->compression_functions;
    local_110 = &this->analyze_states;
    __n_01 = 0;
    do {
      rVar19 = vector<bool,_true>::get<true>(local_100,__n_01);
      if ((*rVar19._M_p & rVar19._M_mask) != 0) {
        pvVar10 = vector<duckdb::vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>,_true>
                  ::operator[](local_108,__n_01);
        local_f0 = vector<duckdb::vector<duckdb::unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>,_true>,_true>
                   ::operator[](local_110,__n_01);
        local_f8 = vector<duckdb::CompressionType,_true>::operator[](&forced_methods,__n_01);
        if ((pvVar10->
            super_vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
            ).
            super__Vector_base<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (pvVar10->
            super_vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
            ).
            super__Vector_base<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_148 = 0xffffffffffffffff;
          _Var18._M_head_impl = (AnalyzeState *)0x0;
          iVar20 = 0xffffffffffffffff;
        }
        else {
          iVar20 = 0xffffffffffffffff;
          local_148 = 0xffffffffffffffff;
          __n = 0;
          _Var23._M_head_impl = (AnalyzeState *)0x0;
          do {
            pvVar12 = vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>::
                      operator[](pvVar10,__n);
            this_01 = vector<duckdb::unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>,_true>
                      ::operator[](local_f0,__n);
            _Var18._M_head_impl = _Var23._M_head_impl;
            if ((this_01->
                super_unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>).
                _M_t.
                super___uniq_ptr_impl<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_>
                .super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>._M_head_impl !=
                (AnalyzeState *)0x0) {
              optional_ptr<duckdb::CompressionFunction,_true>::CheckValid(pvVar12);
              vVar1 = pvVar12->ptr->type;
              vVar2 = *local_f8;
              optional_ptr<duckdb::CompressionFunction,_true>::CheckValid(pvVar12);
              p_Var3 = pvVar12->ptr->final_analyze;
              pAVar13 = unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
                        ::operator*(this_01);
              iVar14 = (*p_Var3)(pAVar13);
              _Var18._M_head_impl = _Var23._M_head_impl;
              if (iVar14 != 0xffffffffffffffff) {
                if ((iVar14 < iVar20) || (vVar1 == vVar2)) {
                  _Var18._M_head_impl =
                       (this_01->
                       super_unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>
                       )._M_t.
                       super___uniq_ptr_impl<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_>
                       .super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>._M_head_impl;
                  (this_01->
                  super_unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_>
                  .super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>._M_head_impl =
                       (AnalyzeState *)0x0;
                  iVar20 = iVar14;
                  local_148 = __n;
                  if (_Var23._M_head_impl != (AnalyzeState *)0x0) {
                    (*(_Var23._M_head_impl)->_vptr_AnalyzeState[1])();
                  }
                }
                in_stack_fffffffffffffea8._M_head_impl = _Var18._M_head_impl;
                if (vVar1 == vVar2) break;
              }
            }
            __n = __n + 1;
            in_stack_fffffffffffffea8._M_head_impl = _Var18._M_head_impl;
            _Var23._M_head_impl = _Var18._M_head_impl;
          } while (__n < (ulong)((long)(pvVar10->
                                       super_vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                                       ).
                                       super__Vector_base<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar10->
                                       super_vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                                       ).
                                       super__Vector_base<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        pvVar15 = vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true>::operator[]
                            (pCVar22->checkpoint_states,__n_01);
        pCVar4 = pvVar15->_M_data->column_data;
        if (_Var18._M_head_impl == (AnalyzeState *)0x0) {
          this_03 = (FatalException *)__cxa_allocate_exception(0x10);
          local_130._M_unused._M_object = &local_120;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_130,
                     "No suitable compression/storage method found to store column of type %s","");
          LogicalType::ToString_abi_cxx11_(&local_50,&pCVar4->type);
          FatalException::FatalException<std::__cxx11::string>
                    (this_03,(string *)&local_130,&local_50);
          __cxa_throw(this_03,&FatalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar12 = vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>::operator[]
                            (pvVar10,local_148);
        optional_ptr<duckdb::CompressionFunction,_true>::CheckValid(pvVar12);
        pCVar21 = pvVar12->ptr;
        this_02 = Logger::Get(pCVar22->db);
        iVar7 = (*this_02->_vptr_Logger[2])(this_02,"duckdb.ColumnDataCheckPointer",0x1e);
        if ((char)iVar7 != '\0') {
          pcVar16 = EnumUtil::ToChars<duckdb::CompressionType>(pCVar21->type);
          ::std::__cxx11::string::string
                    ((string *)&local_90,pcVar16,(allocator *)local_130._M_pod_data);
          DataTableInfo::GetSchemaName_abi_cxx11_(&local_b0,pCVar4->info);
          DataTableInfo::GetTableName_abi_cxx11_(&local_d0,pCVar4->info);
          iVar14 = pCVar4->column_index;
          LogicalType::ToString_abi_cxx11_(&local_70,&pCVar4->type);
          params_2._M_string_length = iVar14;
          params_2._M_dataplus._M_p = (pointer)&local_d0;
          params_2.field_2._M_allocated_capacity = (size_type)&local_70;
          params_2.field_2._8_8_ = iVar20;
          params_4._M_string_length = in_stack_fffffffffffffe98;
          params_4._M_dataplus._M_p = (pointer)pCVar21;
          params_4.field_2._M_allocated_capacity = (size_type)pCVar22;
          params_4.field_2._8_8_ = in_stack_fffffffffffffea8._M_head_impl;
          Logger::
          WriteLog<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long>
                    (this_02,"duckdb.ColumnDataCheckPointer",LOG_INFO,
                     "FinalAnalyze(%s) result for %s.%s.%d(%s): %d",&local_90,&local_b0,params_2,
                     in_stack_fffffffffffffe88,params_4,(unsigned_long)__return_storage_ptr__);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
        }
        pvVar17 = vector<duckdb::CheckpointAnalyzeResult,_true>::operator[]
                            (__return_storage_ptr__,__n_01);
        _Var5.super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>._M_head_impl =
             (pvVar17->analyze_state).
             super_unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>._M_t
             .
             super___uniq_ptr_impl<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_>
             .super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>;
        (pvVar17->analyze_state).
        super_unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>._M_t.
        super___uniq_ptr_impl<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_>.
        super__Head_base<0UL,_duckdb::AnalyzeState_*,_false> =
             (_Head_base<0UL,_duckdb::AnalyzeState_*,_false>)_Var18._M_head_impl;
        this = pCVar22;
        if (_Var5.super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>._M_head_impl !=
            (AnalyzeState *)0x0) {
          (**(code **)(*(long *)_Var5.super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>.
                                _M_head_impl + 8))();
          this = pCVar22;
        }
        (pvVar17->function).ptr = pCVar21;
        pCVar22 = this;
      }
      __n_01 = __n_01 + 1;
    } while (__n_01 < (ulong)((long)(this->checkpoint_states->
                                    super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                                    ).
                                    super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->checkpoint_states->
                                    super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                                    ).
                                    super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (forced_methods.super_vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>
      .super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(forced_methods.
                    super_vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
                    super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return (vector<duckdb::CheckpointAnalyzeResult,_true> *)
         &__return_storage_ptr__->
          super_vector<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>
  ;
}

Assistant:

vector<CheckpointAnalyzeResult> ColumnDataCheckpointer::DetectBestCompressionMethod() {
	D_ASSERT(!compression_functions.empty());
	auto &config = DBConfig::GetConfig(db);
	vector<CompressionType> forced_methods(checkpoint_states.size(), CompressionType::COMPRESSION_AUTO);

	auto compression_type = checkpoint_info.GetCompressionType();
	for (idx_t i = 0; i < checkpoint_states.size(); i++) {
		auto &functions = compression_functions[i];
		if (compression_type != CompressionType::COMPRESSION_AUTO) {
			forced_methods[i] = ForceCompression(functions, compression_type);
		}
		if (compression_type == CompressionType::COMPRESSION_AUTO &&
		    config.options.force_compression != CompressionType::COMPRESSION_AUTO) {
			forced_methods[i] = ForceCompression(functions, config.options.force_compression);
		}
	}

	InitAnalyze();

	// scan over all the segments and run the analyze step
	ScanSegments([&](Vector &scan_vector, idx_t count) {
		for (idx_t i = 0; i < checkpoint_states.size(); i++) {
			if (!has_changes[i]) {
				continue;
			}

			auto &functions = compression_functions[i];
			auto &states = analyze_states[i];
			for (idx_t j = 0; j < functions.size(); j++) {
				auto &state = states[j];
				auto &func = functions[j];

				if (!state) {
					continue;
				}
				if (!func->analyze(*state, scan_vector, count)) {
					state = nullptr;
					func = nullptr;
				}
			}
		}
	});

	vector<CheckpointAnalyzeResult> result;
	result.resize(checkpoint_states.size());

	for (idx_t i = 0; i < checkpoint_states.size(); i++) {
		if (!has_changes[i]) {
			continue;
		}
		auto &functions = compression_functions[i];
		auto &states = analyze_states[i];
		auto &forced_method = forced_methods[i];

		unique_ptr<AnalyzeState> chosen_state;
		idx_t best_score = NumericLimits<idx_t>::Maximum();
		idx_t compression_idx = DConstants::INVALID_INDEX;

		D_ASSERT(functions.size() == states.size());
		for (idx_t j = 0; j < functions.size(); j++) {
			auto &function = functions[j];
			auto &state = states[j];

			if (!state) {
				continue;
			}

			//! Check if the method type is the forced method (if forced is used)
			bool forced_method_found = function->type == forced_method;
			// now that we have passed over all the data, we need to figure out the best method
			// we do this using the final_analyze method
			auto score = function->final_analyze(*state);

			//! The finalize method can return this value from final_analyze to indicate it should not be used.
			if (score == DConstants::INVALID_INDEX) {
				continue;
			}

			if (score < best_score || forced_method_found) {
				compression_idx = j;
				best_score = score;
				chosen_state = std::move(state);
			}
			//! If we have found the forced method, we're done
			if (forced_method_found) {
				break;
			}
		}

		auto &checkpoint_state = checkpoint_states[i];
		auto &col_data = checkpoint_state.get().column_data;
		if (!chosen_state) {
			throw FatalException("No suitable compression/storage method found to store column of type %s",
			                     col_data.type.ToString());
		}
		D_ASSERT(compression_idx != DConstants::INVALID_INDEX);

		auto &best_function = *functions[compression_idx];
		DUCKDB_LOG_INFO(db, "duckdb.ColumnDataCheckPointer", "FinalAnalyze(%s) result for %s.%s.%d(%s): %d",
		                EnumUtil::ToString(best_function.type), col_data.info.GetSchemaName(),
		                col_data.info.GetTableName(), col_data.column_index, col_data.type.ToString(), best_score);
		result[i] = CheckpointAnalyzeResult(std::move(chosen_state), best_function);
	}
	return result;
}